

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,IntVect *nghost,Real time,MultiFab *cmf,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *cbc,
          int cbccomp,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  undefined8 uVar1;
  initializer_list<int> iVar2;
  bool bVar3;
  Box *pBVar4;
  Long LVar5;
  IndexSpace *pIVar6;
  type geom;
  byte bVar7;
  IntVect *in_RSI;
  FabArrayBase *in_RDI;
  int in_R8D;
  int in_R9D;
  Periodicity PVar8;
  IntVect IVar9;
  MFIter *in_stack_00000008;
  FabArray<amrex::FArrayBox> *in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000048;
  undefined4 in_stack_00000050;
  NullInterpHook<amrex::FArrayBox> *in_stack_00000058;
  NullInterpHook<amrex::FArrayBox> *in_stack_00000060;
  Box *dbx;
  Box dfab_bx;
  FAB *dfab;
  MFIter mfi_1;
  FAB *sfab;
  MFIter mfi;
  unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> factory;
  MultiFab mf_crse_patch;
  Box result;
  Box bx_1;
  int N;
  int i_1;
  BoxArray ba_crse_patch;
  int i;
  Box fdomain_g;
  IndexType *typ;
  DistributionMapping *dm;
  BoxArray *ba;
  InterpolaterBoxCoarsener *coarsener;
  int off;
  uint bitval;
  uint typ_1;
  int dir;
  int off_1;
  uint bitval_1;
  uint typ_2;
  int dir_1;
  FabArrayBase *in_stack_fffffffffffff798;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  BoxArray *in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7b8;
  EBSupport a_support;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff7c0;
  uchar flags_;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  undefined4 in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  Geometry *in_stack_fffffffffffff7d8;
  IntVect *pIVar10;
  CpOp op;
  DistributionMapping *in_stack_fffffffffffff7e0;
  BoxArray *in_stack_fffffffffffff7e8;
  NullInterpHook<amrex::FArrayBox> *in_stack_fffffffffffff7f0;
  BaseFab<double> *in_stack_fffffffffffff7f8;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff800;
  int iVar11;
  FabArrayBase *this;
  Geometry *in_stack_fffffffffffff840;
  Geometry *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  int in_stack_fffffffffffff854;
  type in_stack_fffffffffffff858;
  MFIter *in_stack_fffffffffffff860;
  Geometry *in_stack_fffffffffffff868;
  int bcscomp_00;
  undefined1 *in_stack_fffffffffffff870;
  Box local_74c;
  Box *local_730;
  int local_728;
  int in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  IntVect in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8f4;
  MultiFab *in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  IntVect local_6f8;
  Box local_6e8;
  BaseFab<double> *local_6c0;
  MFIter local_6b8;
  BaseFab<double> *local_658;
  MFIter local_650;
  int local_5f0 [3];
  undefined8 local_5e0;
  int local_5d8;
  IntVect local_5d0;
  undefined8 local_5c0;
  int local_5b8;
  undefined1 local_5b0 [8];
  undefined1 local_5a8 [91];
  undefined1 local_54d;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 *local_540;
  Real local_538;
  FabArrayBase local_510;
  undefined1 local_370 [24];
  uint local_358;
  Box local_354;
  Box local_338;
  int local_31c;
  int local_318;
  int local_2a0;
  uint local_29c;
  Box local_298;
  uint local_27c;
  uint *local_278;
  Geometry *local_270;
  BoxArray *local_268;
  undefined1 local_260 [32];
  undefined1 *local_240;
  int local_234;
  int local_230;
  IntVect *local_218;
  FabArrayBase *local_210;
  int local_204;
  IntVect *local_200;
  int local_1f8 [2];
  int local_1f0;
  undefined1 *local_1e8;
  IntVect local_1d8;
  undefined4 local_1cc;
  undefined1 *local_1c8;
  undefined4 local_1bc;
  undefined1 *local_1b8;
  undefined4 local_1ac;
  undefined1 *local_1a8;
  uint local_19c;
  uint *local_198;
  Box *local_190;
  uint local_184;
  uint *local_180;
  Box *local_178;
  int local_170;
  uint local_16c;
  uint local_168;
  int local_164;
  Box *local_160;
  uint local_154;
  int local_150;
  uint local_14c;
  uint local_148;
  int local_144;
  Box *local_140;
  uint local_138;
  int local_134;
  IndexType *local_130;
  int local_124;
  uint *local_120;
  int local_114;
  IndexType *local_110;
  int local_104;
  uint *local_100;
  int local_f8;
  int local_f4;
  IntVect *local_f0;
  int local_e8;
  int local_e4;
  IntVect *local_e0;
  uint local_d8;
  int local_d4;
  IndexType *local_d0;
  uint local_c8;
  int local_c4;
  IndexType *local_c0;
  int local_b4;
  uint *local_b0;
  int local_a4;
  IndexType *local_a0;
  int local_94;
  uint *local_90;
  int local_84;
  IndexType *local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  IndexType *local_60;
  int local_58;
  int local_54;
  IndexType *local_50;
  int local_48;
  int local_44;
  IndexType *local_40;
  int local_38;
  int local_34;
  IndexType *local_30;
  int local_24;
  IntVect *local_20;
  undefined1 *local_18;
  
  local_234 = in_R9D;
  local_230 = in_R8D;
  local_218 = in_RSI;
  local_210 = in_RDI;
  InterpBase::BoxCoarsener
            ((InterpBase *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
             (IntVect *)in_stack_fffffffffffff7a0);
  local_240 = local_260;
  local_268 = FabArrayBase::boxArray(local_210);
  local_270 = (Geometry *)FabArrayBase::DistributionMap(local_210);
  local_27c = (uint)BoxArray::ixType((BoxArray *)in_stack_fffffffffffff798);
  local_278 = &local_27c;
  pBVar4 = Geometry::Domain((Geometry *)in_stack_00000010);
  local_29c = (uint)FabArrayBase::ixType(in_stack_fffffffffffff798);
  local_180 = &local_29c;
  local_298.smallend.vect._0_8_ = *(undefined8 *)(pBVar4->smallend).vect;
  local_298._8_8_ = *(undefined8 *)((pBVar4->smallend).vect + 2);
  local_298.bigend.vect._4_8_ = *(undefined8 *)((pBVar4->bigend).vect + 1);
  local_298.btype.itype = (pBVar4->btype).itype;
  local_160 = &local_298;
  for (local_164 = 0; local_164 < 3; local_164 = local_164 + 1) {
    local_100 = &local_154;
    local_104 = local_164;
    local_b4 = local_164;
    local_68 = local_164;
    bVar7 = (byte)local_164;
    local_168 = (uint)((local_29c & 1 << (bVar7 & 0x1f)) != 0);
    local_110 = &local_298.btype;
    local_114 = local_164;
    local_a4 = local_164;
    local_6c = local_164;
    local_16c = (uint)((local_298.btype.itype & 1 << (bVar7 & 0x1f)) != 0);
    local_170 = local_168 - local_16c;
    local_e0 = &local_298.bigend;
    local_e4 = local_164;
    local_e0->vect[local_164] = local_170 + local_e0->vect[local_164];
    local_c0 = &local_298.btype;
    local_c4 = local_164;
    if (local_168 == 0) {
      local_64 = local_164;
      local_58 = local_164;
      local_298.btype.itype = (1 << (bVar7 & 0x1f) ^ 0xffffffffU) & local_298.btype.itype;
      local_60 = local_c0;
    }
    else {
      local_44 = local_164;
      local_38 = local_164;
      local_298.btype.itype = 1 << (bVar7 & 0x1f) | local_298.btype.itype;
      local_40 = local_c0;
    }
    local_e8 = local_170;
    local_c8 = local_168;
    local_b0 = local_100;
    local_a0 = local_110;
  }
  local_184 = local_29c;
  local_178 = pBVar4;
  local_154 = local_29c;
  for (local_2a0 = 0; local_2a0 < 3; local_2a0 = local_2a0 + 1) {
    bVar3 = Geometry::isPeriodic((Geometry *)in_stack_00000010,local_2a0);
    if (bVar3) {
      local_200 = local_218;
      local_204 = local_2a0;
      Box::grow(&local_298,local_2a0,local_218->vect[local_2a0]);
    }
  }
  BoxArray::size((BoxArray *)0x10e1ca8);
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff7a0,(size_t)in_stack_fffffffffffff798);
  local_318 = 0;
  LVar5 = BoxArray::size((BoxArray *)0x10e1cd2);
  local_31c = (int)LVar5;
  for (; a_support = (EBSupport)((ulong)in_stack_fffffffffffff7b8 >> 0x20), local_318 < local_31c;
      local_318 = local_318 + 1) {
    BoxArray::operator[](in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
    local_18 = local_370;
    local_20 = local_218;
    local_354.btype.itype = local_358;
    Box::grow(&local_354,local_218);
    local_190 = &local_354;
    local_198 = local_278;
    local_338.btype.itype = local_354.btype.itype;
    local_19c = *local_278;
    local_140 = &local_338;
    for (local_144 = 0; local_144 < 3; local_144 = local_144 + 1) {
      local_120 = &local_138;
      local_124 = local_144;
      local_94 = local_144;
      local_70 = local_144;
      bVar7 = (byte)local_144;
      local_148 = (uint)((local_19c & 1 << (bVar7 & 0x1f)) != 0);
      local_130 = &local_338.btype;
      local_134 = local_144;
      local_84 = local_144;
      local_74 = local_144;
      local_14c = (uint)((local_338.btype.itype & 1 << (bVar7 & 0x1f)) != 0);
      local_150 = local_148 - local_14c;
      local_f0 = &local_338.bigend;
      local_f4 = local_144;
      local_f0->vect[local_144] = local_150 + local_f0->vect[local_144];
      local_d0 = &local_338.btype;
      local_d4 = local_144;
      if (local_148 == 0) {
        local_54 = local_144;
        local_48 = local_144;
        local_338.btype.itype = (1 << (bVar7 & 0x1f) ^ 0xffffffffU) & local_338.btype.itype;
        local_50 = local_d0;
      }
      else {
        local_34 = local_144;
        local_24 = local_144;
        local_338.btype.itype = 1 << (bVar7 & 0x1f) | local_338.btype.itype;
        local_30 = local_d0;
      }
      local_f8 = local_150;
      local_d8 = local_148;
      local_90 = local_120;
      local_80 = local_130;
    }
    local_138 = local_19c;
    Box::operator&=(&local_338,&local_298);
    InterpolaterBoxCoarsener::doit
              ((InterpolaterBoxCoarsener *)in_stack_fffffffffffff7a0,
               (Box *)in_stack_fffffffffffff798);
    BoxArray::set((BoxArray *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4,
                  (Box *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  }
  MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff7a0);
  pIVar6 = EB2::TopIndexSpaceIfPresent();
  if (pIVar6 == (IndexSpace *)0x0) {
    local_5a8._16_8_ = 0.0;
    local_5a8._24_8_ = 0.0;
    local_5a8._0_8_ = 0;
    local_5a8._8_8_ = 0.0;
    local_5a8._32_8_ = 0.0;
    in_stack_fffffffffffff840 = (Geometry *)local_5a8;
    MFInfo::MFInfo((MFInfo *)0x10e23a4);
    local_5b0 = (undefined1  [8])0x0;
    geom = (type)local_5b0;
    DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff7a0);
    MultiFab::define((MultiFab *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                     in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                     (int)in_stack_fffffffffffff7d8,
                     (MFInfo *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     in_stack_fffffffffffff800);
    op = (CpOp)in_stack_fffffffffffff7e0;
    DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x10e2411);
    MFInfo::~MFInfo((MFInfo *)0x10e241e);
  }
  else {
    local_54c = 0;
    local_548 = 0;
    local_544 = 0;
    local_540 = &local_54c;
    local_538 = 1.48219693752374e-323;
    in_stack_fffffffffffff870 = &local_54d;
    in_stack_fffffffffffff860 = in_stack_00000008;
    in_stack_fffffffffffff868 = local_270;
    std::allocator<int>::allocator((allocator<int> *)0x10e21a1);
    iVar2._M_array._4_4_ = in_stack_fffffffffffff7ac;
    iVar2._M_array._0_4_ = in_stack_fffffffffffff7a8;
    iVar2._M_len = (size_type)in_stack_fffffffffffff7b0;
    Vector<int,_std::allocator<int>_>::vector
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7a0,iVar2,
               (allocator_type *)in_stack_fffffffffffff798);
    makeEBFabFactory(in_stack_fffffffffffff7d8,
                     (BoxArray *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                     in_stack_fffffffffffff7c0,a_support);
    Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10e220a);
    std::allocator<int>::~allocator((allocator<int> *)0x10e2217);
    local_5a8._64_8_ = 0.0;
    local_5a8._72_8_ = 0.0;
    local_5a8._48_8_ = 0.0;
    local_5a8._56_8_ = 0.0;
    local_5a8._80_8_ = 0.0;
    in_stack_fffffffffffff848 = local_270;
    in_stack_fffffffffffff854 = local_234;
    MFInfo::MFInfo((MFInfo *)0x10e2261);
    geom = std::
           unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
           operator*((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                      *)in_stack_fffffffffffff7a0);
    in_stack_fffffffffffff858 = geom;
    MultiFab::define((MultiFab *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                     in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
                     (int)in_stack_fffffffffffff7d8,
                     (MFInfo *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     in_stack_fffffffffffff800);
    op = (CpOp)in_stack_fffffffffffff7e0;
    MFInfo::~MFInfo((MFInfo *)0x10e22c4);
    std::unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>::
    ~unique_ptr((unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                 *)in_stack_fffffffffffff7b0);
  }
  anon_unknown_115::mf_set_domain_bndry<amrex::MultiFab,_0>
            ((MultiFab *)in_stack_fffffffffffff7a0,(Geometry *)geom);
  PVar8 = Geometry::periodicity
                    ((Geometry *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  local_5d0.vect[2] = PVar8.period.vect[2];
  local_5b8 = local_5d0.vect[2];
  local_5d0.vect._0_8_ = PVar8.period.vect._0_8_;
  local_5c0._0_4_ = local_5d0.vect[0];
  local_5c0._4_4_ = local_5d0.vect[1];
  mfi_00 = (MFIter *)((ulong)geom & 0xffffffff00000000);
  local_5d0 = PVar8.period.vect;
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             (FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
             (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),(int)in_stack_fffffffffffff7c0,
             a_support,(Periodicity *)in_stack_fffffffffffff7b0,op);
  flags_ = (uchar)((ulong)in_stack_fffffffffffff7c0 >> 0x38);
  this = &local_510;
  IVar9 = FabArrayBase::nGrowVect(this);
  local_5f0[2] = IVar9.vect[2];
  local_5d8 = local_5f0[2];
  local_5f0._0_8_ = IVar9.vect._0_8_;
  local_5e0._0_4_ = local_5f0[0];
  local_5e0._4_4_ = local_5f0[1];
  local_5f0 = IVar9.vect;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            ((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *
             )CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
             in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,in_stack_fffffffffffff8e8.vect[2],
             in_stack_fffffffffffff8e8.vect._0_8_,
             (Real)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),SUB84(_local_728,4)
            );
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                 flags_);
  while( true ) {
    bVar3 = MFIter::isValid(&local_650);
    bcscomp_00 = (int)in_stack_fffffffffffff870;
    iVar11 = (int)((ulong)in_stack_00000018 >> 0x20);
    if (!bVar3) break;
    in_stack_fffffffffffff7f8 =
         &FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffff7a0,mfi_00)->
          super_BaseFab<double>;
    in_stack_fffffffffffff7f0 = in_stack_00000058;
    local_658 = in_stack_fffffffffffff7f8;
    pBVar4 = BaseFab<double>::box(in_stack_fffffffffffff7f8);
    NullInterpHook<amrex::FArrayBox>::operator()
              (in_stack_fffffffffffff7f0,(FArrayBox *)in_stack_fffffffffffff7f8,pBVar4,0,local_234);
    MFIter::operator++(&local_650);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff7a0);
  FillPatchInterp<amrex::MultiFab>
            ((MultiFab *)this,iVar11,(MultiFab *)in_stack_fffffffffffff7f8,
             (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),(int)in_stack_fffffffffffff7f0,
             (IntVect *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff840,
             in_stack_fffffffffffff848,
             (Box *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
             (IntVect *)in_stack_fffffffffffff858,(InterpBase *)in_stack_fffffffffffff860,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffff868,
             bcscomp_00);
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_00000050),
                 in_stack_00000048._7_1_);
  while( true ) {
    iVar11 = SUB84(_local_728,4);
    bVar3 = MFIter::isValid(&local_6b8);
    if (!bVar3) break;
    local_6c0 = &FabArray<amrex::FArrayBox>::operator[](in_stack_00000010,in_stack_00000008)->
                 super_BaseFab<double>;
    pBVar4 = BaseFab<double>::box(local_6c0);
    local_6e8.smallend.vect._0_8_ = *(undefined8 *)(pBVar4->smallend).vect;
    uVar1 = *(undefined8 *)((pBVar4->smallend).vect + 2);
    local_6e8._20_8_ = *(undefined8 *)((pBVar4->bigend).vect + 2);
    local_6e8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar4->bigend).vect >> 0x20);
    local_6e8.smallend.vect[2] = (int)uVar1;
    local_6e8.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
    pIVar10 = local_218;
    in_stack_fffffffffffff8e8 = FabArrayBase::nGrowVect(local_210);
    in_stack_fffffffffffff900 = in_stack_fffffffffffff8e8.vect[2];
    in_stack_fffffffffffff8f8 = in_stack_fffffffffffff8e8.vect._0_8_;
    local_1e8 = &stack0xfffffffffffff8f8;
    local_1ac = 0;
    local_1bc = 1;
    local_1cc = 2;
    local_1c8 = local_1e8;
    local_1b8 = local_1e8;
    local_1a8 = local_1e8;
    IntVect::IntVect(&local_1d8,pIVar10->vect[0] - in_stack_fffffffffffff8e8.vect[0],
                     pIVar10->vect[1] - in_stack_fffffffffffff8e8.vect[1],
                     pIVar10->vect[2] - in_stack_fffffffffffff900);
    local_1f0 = local_1d8.vect[2];
    local_1f8[0] = local_1d8.vect[0];
    local_1f8[1] = local_1d8.vect[1];
    local_6f8.vect[2] = local_1d8.vect[2];
    local_6f8.vect[0] = local_1d8.vect[0];
    local_6f8.vect[1] = local_1d8.vect[1];
    _local_728 = local_1d8.vect._0_8_;
    in_stack_fffffffffffff8e0 = local_1d8.vect[2];
    Box::grow(&local_6e8,&local_6f8);
    pBVar4 = &local_74c;
    Box::operator&((Box *)in_stack_00000010,(Box *)in_stack_00000008);
    local_730 = pBVar4;
    NullInterpHook<amrex::FArrayBox>::operator()
              (in_stack_00000060,(FArrayBox *)local_6c0,pBVar4,local_230,local_234);
    MFIter::operator++(&local_6b8);
  }
  MFIter::~MFIter((MFIter *)in_stack_00000010);
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            ((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *
             )CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
             in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,in_stack_fffffffffffff8e8.vect[2],
             in_stack_fffffffffffff8e8.vect._0_8_,
             (Real)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),iVar11);
  MultiFab::~MultiFab((MultiFab *)0x10e29e4);
  BoxArray::~BoxArray((BoxArray *)in_stack_00000010);
  InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener((InterpolaterBoxCoarsener *)0x10e29fe);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
InterpFromCoarseLevel (MF& mf, IntVect const& nghost, Real time,
                       const MF& cmf, int scomp, int dcomp, int ncomp,
                       const Geometry& cgeom, const Geometry& fgeom,
                       BC& cbc, int cbccomp,
                       BC& fbc, int fbccomp,
                       const IntVect& ratio,
                       Interp* mapper,
                       const Vector<BCRec>& bcs, int bcscomp,
                       const PreInterpHook& pre_interp,
                       const PostInterpHook& post_interp)
{
    using FAB = typename MF::FABType::value_type;

    const InterpolaterBoxCoarsener& coarsener = mapper->BoxCoarsener(ratio);

    const BoxArray& ba = mf.boxArray();
    const DistributionMapping& dm = mf.DistributionMap();

    const IndexType& typ = ba.ixType();

    BL_ASSERT(typ == cmf.boxArray().ixType());

    Box fdomain_g( amrex::convert(fgeom.Domain(),mf.ixType()) );
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            fdomain_g.grow(i,nghost[i]);
        }
    }

    BoxArray ba_crse_patch(ba.size());
    {  // TODO: later we might want to cache this
        for (int i = 0, N = ba.size(); i < N; ++i)
        {
            Box bx = amrex::convert(amrex::grow(ba[i],nghost), typ);
            bx &= fdomain_g;
            ba_crse_patch.set(i, coarsener.doit(bx));
        }
    }

    MF mf_crse_patch;
#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        auto factory = makeEBFabFactory(cgeom, ba_crse_patch, dm, {0,0,0}, EBSupport::basic);
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0, MFInfo(), *factory);
    } else
#endif
    {
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0);
    }
    mf_set_domain_bndry (mf_crse_patch, cgeom);

    mf_crse_patch.ParallelCopy(cmf, scomp, 0, ncomp, cgeom.periodicity());

    cbc(mf_crse_patch, 0, ncomp, mf_crse_patch.nGrowVect(), time, cbccomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_crse_patch); mfi.isValid(); ++mfi)
    {
        FAB& sfab   = mf_crse_patch[mfi];
        pre_interp(sfab, sfab.box(), 0, ncomp);
    }

    FillPatchInterp(mf, dcomp, mf_crse_patch, 0, ncomp, nghost, cgeom, fgeom, fdomain_g,
                    ratio, mapper, bcs, bcscomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        FAB& dfab   = mf[mfi];
        Box dfab_bx = dfab.box();
        dfab_bx.grow(nghost-mf.nGrowVect());
        const Box& dbx = dfab_bx & fdomain_g;

        post_interp(dfab, dbx, dcomp, ncomp);
    }

    fbc(mf, dcomp, ncomp, nghost, time, fbccomp);
}